

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamwriter.cpp
# Opt level: O1

void __thiscall QCborStreamWriter::append(QCborStreamWriter *this,QLatin1StringView str)

{
  size_t allocSize_00;
  bool bVar1;
  size_t __size;
  char *pcVar2;
  char *in_RCX;
  QtPrivate *this_00;
  size_t allocSize;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QLatin1StringView in;
  QVarLengthArray<char,_256LL> utf8;
  size_t local_150;
  size_t local_148;
  QUtf8 *local_140;
  QUtf8 local_138 [256];
  long local_38;
  
  s.m_data = str.m_data;
  this_00 = (QtPrivate *)str.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  s.m_size = (qsizetype)s.m_data;
  bVar1 = QtPrivate::isAscii(this_00,s);
  if (bVar1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      encode_string(&((this->d)._M_t.
                      super___uniq_ptr_impl<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_QCborStreamWriterPrivate_*,_std::default_delete<QCborStreamWriterPrivate>_>
                      .super__Head_base<0UL,_QCborStreamWriterPrivate_*,_false>._M_head_impl)->
                     encoder,(size_t)this_00,'`',s.m_data);
      return;
    }
  }
  else {
    memset(&local_150,0xaa,0x118);
    allocSize_00 = (long)this_00 * 2;
    local_150 = 0x100;
    local_148 = 0;
    local_140 = local_138;
    if (0x80 < (long)this_00) {
      local_150 = allocSize_00;
      __size = QtPrivate::expectedAllocSize(allocSize_00,0x10);
      if (__size == 0) {
        __size = allocSize_00;
      }
      local_140 = (QUtf8 *)malloc(__size);
      local_150 = __size;
      if (local_140 == (QUtf8 *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          qBadAlloc();
        }
        goto LAB_004aeb55;
      }
    }
    in.m_data = in_RCX;
    in.m_size = (qsizetype)s.m_data;
    local_148 = allocSize_00;
    pcVar2 = QUtf8::convertFromLatin1(local_140,(char *)this_00,in);
    encode_string(&((this->d)._M_t.
                    super___uniq_ptr_impl<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_QCborStreamWriterPrivate_*,_std::default_delete<QCborStreamWriterPrivate>_>
                    .super__Head_base<0UL,_QCborStreamWriterPrivate_*,_false>._M_head_impl)->encoder
                  ,(long)pcVar2 - (long)local_140,'`',local_140);
    if (local_140 != local_138) {
      QtPrivate::sizedFree(local_140,local_150);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
LAB_004aeb55:
  __stack_chk_fail();
}

Assistant:

void QCborStreamWriter::append(QLatin1StringView str)
{
    // We've got Latin-1 but CBOR wants UTF-8, so check if the string is the
    // common subset (US-ASCII).
    if (QtPrivate::isAscii(str)) {
        // it is plain US-ASCII
        appendTextString(str.latin1(), str.size());
    } else {
        // non-ASCII, convert:
        QVarLengthArray<char> utf8(str.size() * 2); // each L1 char gives at most two U8 units
        const qsizetype written = QUtf8::convertFromLatin1(utf8.data(), str) - utf8.data();
        appendTextString(utf8.data(), written);
    }
}